

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::~Graph(Graph *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  long lVar3;
  
  pvVar1 = this->adjacencyVector;
  if (pvVar1 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar2 = pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (piVar2 != (pointer)0x0) {
      lVar3 = (long)piVar2 * 0x18;
      do {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)
                   ((long)&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
    operator_delete__(&pvVar1[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  if (this->inDegree != (int *)0x0) {
    operator_delete__(this->inDegree);
    return;
  }
  return;
}

Assistant:

Graph::~Graph() {
    delete[] adjacencyVector;
    delete[] inDegree;
}